

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::isSignExted(OptimizeInstructions *this,Expression *curr,Index bits)

{
  Index IVar1;
  Expression *pEVar2;
  
  pEVar2 = Properties::getSignExtValue(curr);
  if (pEVar2 == (Expression *)0x0) {
    if (curr->_id != LocalGetId) {
      return false;
    }
    IVar1 = (this->localInfo).super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[curr[1]._id].signExtedBits;
  }
  else {
    IVar1 = Properties::getSignExtBits(curr);
  }
  return IVar1 == bits;
}

Assistant:

bool isSignExted(Expression* curr, Index bits) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr) == bits;
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // check what we know about the local
      return localInfo[get->index].signExtedBits == bits;
    }
    return false;
  }